

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_mac_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  void *__src;
  void *__dest;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_mac_pmeth_data *src_data;
  gost_mac_pmeth_data *dst_data;
  undefined4 local_4;
  
  iVar1 = pkey_gost_mac_init(in_RSI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    __src = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)in_RSI);
    __dest = EVP_PKEY_CTX_get_data(in_RDI);
    if ((__src == (void *)0x0) || (__dest == (void *)0x0)) {
      local_4 = 0;
    }
    else {
      memcpy(__dest,__src,0x30);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_mac_copy(EVP_PKEY_CTX *dst, ossl3_const EVP_PKEY_CTX *src)
{
    struct gost_mac_pmeth_data *dst_data, *src_data;
    if (!pkey_gost_mac_init(dst)) {
        return 0;
    }
    src_data = EVP_PKEY_CTX_get_data(src);
    dst_data = EVP_PKEY_CTX_get_data(dst);
    if (!src_data || !dst_data)
        return 0;

    *dst_data = *src_data;
    return 1;
}